

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

ssize_t __thiscall Arcflow::write(Arcflow *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  runtime_error *prVar2;
  FILE *__stream;
  undefined4 extraout_var;
  void *__buf_00;
  undefined4 in_register_00000034;
  char local_238 [8];
  char _error_msg__1 [256];
  FILE *fout;
  char local_118 [8];
  char _error_msg_ [256];
  char *fname_local;
  Arcflow *this_local;
  
  _error_msg_._248_8_ = CONCAT44(in_register_00000034,__fd);
  if ((this->ready & 1U) != 1) {
    snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == true",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x261);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,local_118);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __stream = fopen((char *)_error_msg_._248_8_,"w");
  if (__stream != (FILE *)0x0) {
    write(this,(int)__stream,__buf_00,__n);
    iVar1 = fclose(__stream);
    return CONCAT44(extraout_var,iVar1);
  }
  perror("fopen");
  snprintf(local_238,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d","fout != NULL",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x266);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,local_238);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::write(const char *fname) {
	throw_assert(ready == true);
	FILE *fout = fopen(fname, "w");
	if (fout == NULL) {
		perror("fopen");
	}
	throw_assert(fout != NULL);
	write(fout);
	fclose(fout);
}